

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceVariableBase.hpp
# Opt level: O2

Uint32 Diligent::GetResourceSampleCount(ITextureView *pTexView)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  char (*in_RCX) [20];
  string msg;
  string local_30;
  
  if (pTexView == (ITextureView *)0x0) {
    FormatString<char[26],char[20]>
              (&local_30,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"pTexView != nullptr",in_RCX);
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"GetResourceSampleCount",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
               ,0x15b);
    std::__cxx11::string::~string((string *)&local_30);
  }
  iVar1 = (*(pTexView->super_IDeviceObject).super_IObject._vptr_IObject[10])(pTexView);
  lVar2 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x20))
                    ((long *)CONCAT44(extraout_var,iVar1));
  return *(Uint32 *)(lVar2 + 0x20);
}

Assistant:

inline Uint32 GetResourceSampleCount(const ITextureView* pTexView)
{
    VERIFY_EXPR(pTexView != nullptr);
    return const_cast<ITextureView*>(pTexView)->GetTexture()->GetDesc().SampleCount;
}